

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::val::ValidationState_t::GetOperandTypeId
          (ValidationState_t *this,Instruction *inst,size_t operand_index)

{
  uint id;
  uint32_t uVar1;
  
  id = Instruction::GetOperandAs<unsigned_int>(inst,operand_index);
  uVar1 = GetTypeId(this,id);
  return uVar1;
}

Assistant:

uint32_t ValidationState_t::GetOperandTypeId(const Instruction* inst,
                                             size_t operand_index) const {
  return GetTypeId(inst->GetOperandAs<uint32_t>(operand_index));
}